

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O3

void prt_equippy(wchar_t row,wchar_t col)

{
  byte bVar1;
  wchar_t c;
  object *obj;
  wchar_t a;
  wchar_t slot;
  
  if ((player->body).count != 0) {
    slot = L'\0';
    do {
      obj = slot_object(player,slot);
      c = L' ';
      a = L'\x01';
      if (((obj != (object *)0x0) && (tile_width == '\x01')) && (tile_height == '\x01')) {
        c = object_char(obj);
        bVar1 = object_attr(obj);
        a = (wchar_t)bVar1;
      }
      Term_putch(col + slot,row,a,c);
      slot = slot + L'\x01';
    } while ((uint)slot < (uint)(player->body).count);
  }
  return;
}

Assistant:

static void prt_equippy(int row, int col)
{
	int i;

	uint8_t a;
	wchar_t c;

	struct object *obj;

	/* Dump equippy chars */
	for (i = 0; i < player->body.count; i++) {
		/* Object */
		obj = slot_object(player, i);

		/* Get attr/char for display; clear if big tiles or no object */
		if (obj && tile_width == 1 && tile_height == 1) {
			c = object_char(obj);
			a = object_attr(obj);
		} else {
			c = L' ';
			a = COLOUR_WHITE;
		}

		/* Dump */
		Term_putch(col + i, row, a, c);
	}
}